

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int cvEwtSet(N_Vector ycur,N_Vector weight,void *data)

{
  CVodeMem in_RDX;
  int flag;
  CVodeMem cv_mem;
  int iVar1;
  
  iVar1 = 0;
  if (in_RDX->cv_itol == 1) {
    iVar1 = cvEwtSetSS(in_RDX,(N_Vector)in_RDX,(N_Vector)0x1);
  }
  else if (in_RDX->cv_itol == 2) {
    iVar1 = cvEwtSetSV(in_RDX,(N_Vector)in_RDX,(N_Vector)0x2);
  }
  return iVar1;
}

Assistant:

int cvEwtSet(N_Vector ycur, N_Vector weight, void* data)
{
  CVodeMem cv_mem;
  int flag = 0;

  /* data points to cv_mem here */

  cv_mem = (CVodeMem)data;

  switch (cv_mem->cv_itol)
  {
  case CV_SS: flag = cvEwtSetSS(cv_mem, ycur, weight); break;
  case CV_SV: flag = cvEwtSetSV(cv_mem, ycur, weight); break;
  }

  return (flag);
}